

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O0

void hide_tractor_beams(Am_Object *ship_obj,bool become_visible)

{
  Am_Slot_Key AVar1;
  byte bVar2;
  Am_Value *pAVar3;
  Am_Wrapper *pAVar4;
  Am_Value_List local_58 [8];
  Am_Value_List other_beams;
  Am_Value_List local_48 [8];
  Am_Value_List beams;
  Am_Object local_28;
  Am_Object other_ship;
  Am_Object beam;
  bool become_visible_local;
  Am_Object *ship_obj_local;
  
  Am_Object::Am_Object(&other_ship);
  Am_Object::Am_Object(&local_28);
  Am_Value_List::Am_Value_List(local_48);
  Am_Value_List::Am_Value_List(local_58);
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)ship_obj,(ulong)TB_LIST);
  Am_Value_List::operator=(local_48,pAVar3);
  Am_Value_List::Start();
  while (bVar2 = Am_Value_List::Last(), ((bVar2 ^ 0xff) & 1) != 0) {
    pAVar3 = (Am_Value *)Am_Value_List::Get();
    Am_Object::operator=(&other_ship,pAVar3);
    pAVar3 = (Am_Value *)Am_Object::Get((ushort)&other_ship,(ulong)TB_SOURCE);
    Am_Object::operator=(&local_28,pAVar3);
    bVar2 = Am_Object::operator==(&local_28,(Am_Object *)ship_obj);
    if ((bVar2 & 1) != 0) {
      pAVar3 = (Am_Value *)Am_Object::Get((ushort)&other_ship,(ulong)TB_DEST);
      Am_Object::operator=(&local_28,pAVar3);
    }
    pAVar3 = (Am_Value *)Am_Object::Get((ushort)&local_28,(ulong)TB_LIST);
    Am_Value_List::operator=(local_58,pAVar3);
    if (become_visible) {
      pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&other_ship);
      Am_Value_List::Add(local_58,pAVar4,1);
    }
    else {
      Am_Value_List::Start();
      Am_Object::operator_cast_to_Am_Wrapper_(&other_ship);
      bVar2 = Am_Value_List::Member((Am_Wrapper *)local_58);
      if ((bVar2 & 1) != 0) {
        Am_Value_List::Delete(SUB81(local_58,0));
      }
    }
    Am_Object::Set((ushort)&other_ship,true,(ulong)(become_visible & 1));
    AVar1 = TB_LIST;
    pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(local_58);
    Am_Object::Set((ushort)&local_28,(Am_Wrapper *)(ulong)AVar1,(ulong)pAVar4);
    Am_Value_List::Next();
  }
  Am_Value_List::~Am_Value_List(local_58);
  Am_Value_List::~Am_Value_List(local_48);
  Am_Object::~Am_Object(&local_28);
  Am_Object::~Am_Object(&other_ship);
  return;
}

Assistant:

void
hide_tractor_beams(Am_Object ship_obj, bool become_visible)
{
  Am_Object beam, other_ship;
  Am_Value_List beams, other_beams;
  beams = ship_obj.Get(TB_LIST);
  for (beams.Start(); !beams.Last(); beams.Next()) {
    beam = beams.Get();

    // Remove tractor beam from the value list of its other attached ship
    other_ship = beam.Get(TB_SOURCE);
    if (other_ship == ship_obj)
      // Oops, ship_obj was the source, we meant to get TB_DEST
      other_ship = beam.Get(TB_DEST);
    other_beams = other_ship.Get(TB_LIST);
    if (become_visible) { // then add it to other ships
      other_beams.Add(beam);
    } else { // remove it from other ship's list
      other_beams.Start();
      if (other_beams.Member(beam)) //sets the pointer to beam
        other_beams.Delete();
    }
    beam.Set(Am_VISIBLE, become_visible);
    other_ship.Set(TB_LIST, other_beams);
  }
}